

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::addLearnedClause(Solver *this,vec<Minisat::Lit> *cls)

{
  ulong *puVar1;
  double dVar2;
  int iVar3;
  Lit p;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  CRef cr;
  CRef local_1c;
  
  if (this->receiveClauses == true) {
    this->receivedCls = this->receivedCls + 1;
    if (cls->sz == 1) {
      iVar3 = cls->data->x;
      if (((byte)iVar3 & 1 ^ (this->assigns).data[iVar3 >> 1].value) == 1) {
        this->ok = false;
      }
      else {
        cancelUntil(this,0,false);
        p.x = cls->data->x;
        if (((this->assigns).data[p.x >> 1].value & 2) != 0) {
          uncheckedEnqueue(this,p,0,0xffffffff);
          return;
        }
      }
    }
    else {
      local_1c = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(&this->ca,cls,true);
      vec<unsigned_int>::push(&this->learnts_local,&local_1c);
      attachClause(this,local_1c);
      puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      puVar1 = (ulong *)(puVar4 + local_1c);
      dVar2 = this->cla_inc;
      fVar8 = (float)((double)*(float *)((long)puVar1 + (*puVar1 >> 0x22) * 4 + 8) + dVar2);
      *(float *)((long)puVar1 + (*puVar1 >> 0x22) * 4 + 8) = fVar8;
      if (1e+20 < fVar8) {
        lVar6 = (long)(this->learnts_local).sz;
        if (0 < lVar6) {
          puVar5 = (this->learnts_local).data;
          lVar7 = 0;
          do {
            puVar1 = (ulong *)(puVar4 + puVar5[lVar7]);
            *(float *)((long)puVar1 + (*puVar1 >> 0x22) * 4 + 8) =
                 *(float *)((long)puVar1 + (*puVar1 >> 0x22) * 4 + 8) * 1e-20;
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
        }
        this->cla_inc = dVar2 * 1e-20;
      }
    }
  }
  return;
}

Assistant:

void Solver::addLearnedClause(const vec<Lit> &cls)
{
    /* allow to reject clause */
    if (!receiveClauses) return;

    assert(cls.size() > 0 && "should we really share empty clauses?");
    // TODO: implement filters here!

    receivedCls++;

    if (cls.size() == 1) {
        if (value(cls[0]) == l_False) {
            ok = false;
        } else {
            cancelUntil(0);
            if (value(cls[0]) == l_Undef) uncheckedEnqueue(cls[0], 0);
        }
    } else {
        /* currently, we cannot tell much about the quality of the clause */
        CRef cr = ca.alloc(cls, true);
        learnts_local.push(cr);
        assert((value(cls[0]) != l_False || value(cls[1]) != l_False) && "cannot watch falsified literals");
        attachClause(cr);
        claBumpActivity(ca[cr]);
    }
}